

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  undefined4 *puVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  
  pvVar1 = _kernel->data;
  iVar5 = outch + 7;
  if (-1 < outch) {
    iVar5 = outch;
  }
  iVar8 = outch % 8 + 3;
  if (-1 < outch % 8) {
    iVar8 = outch % 8;
  }
  iVar9 = 0;
  Mat::create(kernel_tm,kernel_size * 8,inch,outch % 4 + (iVar5 >> 3) + (iVar8 >> 2),4,
              (Allocator *)0x0);
  uVar4 = outch >> 3;
  if (0 < (int)uVar4) {
    pvVar7 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    iVar12 = kernel_size * inch;
    sVar3 = kernel_tm->elemsize;
    iVar14 = iVar12 * 8;
    local_7c = iVar12 * 7;
    iVar8 = iVar12 * 2;
    local_80 = iVar12 * 6;
    local_84 = iVar12 * 5;
    local_88 = iVar12 * 4;
    iVar5 = iVar12 * 3;
    uVar13 = 0;
    iVar18 = iVar12;
    do {
      if (0 < iVar12) {
        lVar11 = 0;
        iVar17 = iVar12;
        do {
          *(undefined4 *)((long)pvVar7 + lVar11 * 8) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)iVar9 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 4) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)iVar18 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 8) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)iVar8 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 0xc) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)iVar5 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 0x10) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)local_88 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 0x14) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)local_84 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 0x18) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)local_80 * 4);
          *(undefined4 *)((long)pvVar7 + lVar11 * 8 + 0x1c) =
               *(undefined4 *)((long)pvVar1 + lVar11 + (long)local_7c * 4);
          lVar11 = lVar11 + 4;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar13 = uVar13 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
      local_7c = local_7c + iVar14;
      local_80 = local_80 + iVar14;
      local_84 = local_84 + iVar14;
      local_88 = local_88 + iVar14;
      iVar5 = iVar5 + iVar14;
      iVar8 = iVar8 + iVar14;
      iVar18 = iVar18 + iVar14;
      iVar9 = iVar9 + iVar14;
    } while (uVar13 != uVar4);
  }
  uVar6 = outch & 0xfffffff8;
  if ((((uint)outch >> 2 & 1) != 0) && (iVar5 = kernel_size * inch, 0 < iVar5)) {
    puVar10 = (undefined4 *)
              ((long)(int)uVar4 * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    lVar11 = 0;
    do {
      *puVar10 = *(undefined4 *)((long)pvVar1 + lVar11 * 4 + (long)(int)(iVar5 * uVar6) * 4);
      puVar10[1] = *(undefined4 *)((long)pvVar1 + lVar11 * 4 + (long)(int)((uVar6 + 1) * iVar5) * 4)
      ;
      puVar10[2] = *(undefined4 *)((long)pvVar1 + lVar11 * 4 + (long)(int)((uVar6 + 2) * iVar5) * 4)
      ;
      puVar10[3] = *(undefined4 *)((long)pvVar1 + lVar11 * 4 + (long)(int)((uVar6 + 3) * iVar5) * 4)
      ;
      lVar11 = lVar11 + 1;
      puVar10 = puVar10 + 4;
    } while (iVar5 != (int)lVar11);
  }
  iVar5 = uVar6 + ((uint)outch >> 2 & 1) * 4;
  if (iVar5 < outch) {
    pvVar7 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    iVar8 = kernel_size * inch;
    lVar11 = (long)iVar5;
    sVar3 = kernel_tm->elemsize;
    iVar5 = iVar8 * iVar5;
    do {
      if (0 < iVar8) {
        uVar4 = (uint)lVar11;
        uVar15 = uVar4 + 7;
        uVar6 = uVar4 + 3;
        if (-1 < (int)uVar4) {
          uVar15 = uVar4;
          uVar6 = uVar4;
        }
        iVar18 = uVar4 - (uVar15 & 0xfffffff8);
        iVar9 = (uVar4 - (uVar15 & 0xfffffff8)) + 3;
        if (-1 < iVar18) {
          iVar9 = iVar18;
        }
        lVar16 = 0;
        do {
          *(undefined4 *)
           ((long)pvVar7 +
           lVar16 * 4 +
           (long)(int)((iVar9 >> 2) + ((int)uVar15 >> 3) + (uVar4 - (uVar6 & 0xfffffffc))) *
           sVar2 * sVar3) = *(undefined4 *)((long)pvVar1 + lVar16 * 4 + (long)iVar5 * 4);
          lVar16 = lVar16 + 1;
        } while (iVar8 != (int)lVar16);
      }
      lVar11 = lVar11 + 1;
      iVar5 = iVar5 + iVar8;
    } while (lVar11 < outch);
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 8 x 8
    kernel_tm.create(8 * kernel_size, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 3;
    remain_outch_start = nn_outch << 3;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;
        const float* k4 = kernel + (p + 4) * inch * kernel_size;
        const float* k5 = kernel + (p + 5) * inch * kernel_size;
        const float* k6 = kernel + (p + 6) * inch * kernel_size;
        const float* k7 = kernel + (p + 7) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp[4] = k4[0];
            ktmp[5] = k5[0];
            ktmp[6] = k6[0];
            ktmp[7] = k7[0];
            ktmp += 8;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
            k4 += 1;
            k5 += 1;
            k6 += 1;
            k7 += 1;
        }
    }

    nn_outch = (outch - remain_outch_start) >> 2;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = remain_outch_start + pp * 4;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    for (int p = remain_outch_start; p < outch; p++)
    {
        const float* k0 = kernel + (p + 0) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4 + p % 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}